

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O3

bool __thiscall
anurbs::TypeEntry<anurbs::Brep,_anurbs::Model>::save
          (TypeEntry<anurbs::Brep,_anurbs::Model> *this,Model *model,size_t index,Json *target)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Attributes *this_00;
  Brep *data;
  bool bVar3;
  Model *model_00;
  Ref<anurbs::Brep> entry;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  model_00 = (Model *)&stack0xffffffffffffffd8;
  Model::get<anurbs::Brep>((Model *)&stack0xffffffffffffffd8,(size_t)model);
  if (local_28 != (element_type *)0x0) {
    peVar1 = (local_28->m_data).super___shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (local_28->m_data).super___shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (peVar1 != (element_type *)0x0) {
      data = Ref<anurbs::Brep>::operator*((Ref<anurbs::Brep> *)&stack0xffffffffffffffd8);
      Brep::save(model_00,data,target);
      this_00 = (local_28->m_attributes).
                super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (local_28->m_attributes).
               super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      Attributes::
      save<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (this_00,model,target);
      bVar3 = true;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      goto LAB_001ea4fb;
    }
  }
  bVar3 = false;
LAB_001ea4fb:
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return bVar3;
}

Assistant:

bool save(const TModel& model, const size_t index, Json& target) override
    {
        const auto entry = model.template get<TData>(index);

        if (entry.is_empty() || entry.data() == nullptr) {
            return false;
        }

        TData::save(model, *entry, target);
        entry.attributes()->save(model, target);

        return true;
    }